

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenBecomesReadable(FdObserver *this)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *pPVar5;
  long in_RSI;
  Promise<void> PVar6;
  PromiseFulfillerPair<void> paf;
  Fault local_38;
  long *local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  if ((*(byte *)(in_RSI + 0xc) & 1) != 0) {
    newPromiseAndFulfiller<void>();
    uVar3 = (undefined4)uStack_20;
    uVar4 = uStack_20._4_4_;
    uStack_20 = (long *)0x0;
    puVar1 = *(undefined8 **)(in_RSI + 0x10);
    plVar2 = *(long **)(in_RSI + 0x18);
    *(undefined4 *)(in_RSI + 0x10) = local_28;
    *(undefined4 *)(in_RSI + 0x14) = uStack_24;
    *(undefined4 *)(in_RSI + 0x18) = uVar3;
    *(undefined4 *)(in_RSI + 0x1c) = uVar4;
    pPVar5 = extraout_RDX;
    if (plVar2 != (long *)0x0) {
      (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      pPVar5 = extraout_RDX_00;
    }
    plVar2 = uStack_20;
    this->eventPort = (UnixEventPort *)local_38.exception;
    *(long **)&this->fd = local_30;
    local_30 = (long *)0x0;
    if (uStack_20 != (long *)0x0) {
      uStack_20 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_24,local_28))
                ((undefined8 *)CONCAT44(uStack_24,local_28),
                 (long)plVar2 + *(long *)(*plVar2 + -0x10));
      pPVar5 = extraout_RDX_01;
    }
    plVar2 = local_30;
    if (local_30 != (long *)0x0) {
      local_30 = (long *)0x0;
      (**(_func_int **)((local_38.exception)->ownFile).content.ptr)
                (local_38.exception,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      pPVar5 = extraout_RDX_02;
    }
    PVar6.super_PromiseBase.node.ptr = pPVar5;
    PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar6.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x180,FAILED,"flags & OBSERVE_READ","\"FdObserver was not set to observe reads.\"",
             (char (*) [41])"FdObserver was not set to observe reads.");
  _::Debug::Fault::fatal(&local_38);
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenBecomesReadable() {
  KJ_REQUIRE(flags & OBSERVE_READ, "FdObserver was not set to observe reads.");

  auto paf = newPromiseAndFulfiller<void>();
  readFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}